

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>_>
 __thiscall
testing::
Return<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>>>
          (testing *this,
          ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>_>
  RVar1;
  __uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_> _Stack_38;
  
  std::__uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>::__uniq_ptr_impl
            (&_Stack_38,(__uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_> *)value);
  internal::
  ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>_>
  ::ReturnAction((ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>_>
                  *)this,(ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>
                          *)&_Stack_38);
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr
            ((unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> *)&_Stack_38);
  RVar1.value_.
  super___shared_ptr<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  RVar1.value_.
  super___shared_ptr<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>_>
          )RVar1.value_.
           super___shared_ptr<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

internal::ReturnAction<R> Return(R value) {
  return internal::ReturnAction<R>(std::move(value));
}